

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O2

int fe_warp_set(melfb_t *mel,char *id_name)

{
  int iVar1;
  char **ppcVar2;
  uint32 uVar3;
  long lVar4;
  
  ppcVar2 = name2id;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    iVar1 = strcmp(id_name,*ppcVar2);
    if (iVar1 == 0) goto LAB_0012c85b;
    ppcVar2 = ppcVar2 + 1;
  }
  ppcVar2 = __name2id;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    iVar1 = strcmp(id_name,*ppcVar2);
    if (iVar1 == 0) goto LAB_0012c85b;
    ppcVar2 = ppcVar2 + 1;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
          ,0x78,"Unimplemented warping function %s\n",id_name);
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
          ,0x79,"Implemented functions are:\n");
  iVar1 = -2;
  uVar3 = 0xffffffff;
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    fprintf(_stderr,"\t%s\n",*(undefined8 *)((long)name2id + lVar4));
  }
LAB_0012c85d:
  mel->warp_id = uVar3;
  return iVar1;
LAB_0012c85b:
  uVar3 = (uint32)lVar4;
  iVar1 = 0;
  goto LAB_0012c85d;
}

Assistant:

int
fe_warp_set(melfb_t *mel, const char *id_name)
{
    uint32 i;

    for (i = 0; name2id[i]; i++) {
        if (strcmp(id_name, name2id[i]) == 0) {
            mel->warp_id = i;
            break;
        }
    }

    if (name2id[i] == NULL) {
        for (i = 0; __name2id[i]; i++) {
            if (strcmp(id_name, __name2id[i]) == 0) {
                mel->warp_id = i;
                break;
            }
        }
        if (__name2id[i] == NULL) {
            E_ERROR("Unimplemented warping function %s\n", id_name);
            E_ERROR("Implemented functions are:\n");
            for (i = 0; name2id[i]; i++) {
                fprintf(stderr, "\t%s\n", name2id[i]);
            }
            mel->warp_id = FE_WARP_ID_NONE;

            return FE_START_ERROR;
        }
    }

    return FE_SUCCESS;
}